

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

int secp256k1_scalar_reduce(secp256k1_scalar *r,uint overflow)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (overflow < 2) {
    uVar5 = (ulong)overflow;
    uVar2 = r->d[0];
    r->d[0] = r->d[0] + uVar5 * 0x402da1732fc9bebf;
    puVar1 = r->d + 1;
    uVar3 = (ulong)CARRY8(uVar2,uVar5 * 0x402da1732fc9bebf);
    uVar2 = *puVar1;
    uVar4 = *puVar1 + uVar5 * 0x4551231950b75fc4;
    *puVar1 = uVar4 + uVar3;
    puVar1 = r->d + 2;
    uVar4 = (ulong)(CARRY8(uVar2,uVar5 * 0x4551231950b75fc4) || CARRY8(uVar4,uVar3));
    uVar2 = *puVar1;
    uVar3 = *puVar1;
    *puVar1 = uVar3 + uVar5 + uVar4;
    r->d[3] = r->d[3] + (ulong)(CARRY8(uVar2,uVar5) || CARRY8(uVar3 + uVar5,uVar4));
    secp256k1_scalar_verify(r);
    return overflow;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/scalar_4x64_impl.h"
          ,0x4c,"test condition failed: overflow <= 1");
  abort();
}

Assistant:

SECP256K1_INLINE static int secp256k1_scalar_reduce(secp256k1_scalar *r, unsigned int overflow) {
    secp256k1_uint128 t;
    VERIFY_CHECK(overflow <= 1);

    secp256k1_u128_from_u64(&t, r->d[0]);
    secp256k1_u128_accum_u64(&t, overflow * SECP256K1_N_C_0);
    r->d[0] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[1]);
    secp256k1_u128_accum_u64(&t, overflow * SECP256K1_N_C_1);
    r->d[1] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[2]);
    secp256k1_u128_accum_u64(&t, overflow * SECP256K1_N_C_2);
    r->d[2] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[3]);
    r->d[3] = secp256k1_u128_to_u64(&t);

    SECP256K1_SCALAR_VERIFY(r);
    return overflow;
}